

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

int __thiscall Fl_Text_Display::handle(Fl_Text_Display *this,int event)

{
  Fl_Text_Buffer *pFVar1;
  Fl_Text_Buffer *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Fl_Window *pFVar8;
  EVP_PKEY_CTX *pEVar9;
  size_t sVar10;
  _func_int *UNRECOVERED_JUMPTABLE;
  int posType;
  fd_set *__writefds;
  Fl_Cursor FVar11;
  undefined8 uVar12;
  fd_set *in_R8;
  timeval *in_R9;
  int end;
  int start;
  int local_30;
  int local_2c;
  
  if (this->mBuffer == (Fl_Text_Buffer *)0x0) {
    return 0;
  }
  iVar3 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,
                           (this->text_area).h);
  iVar5 = Fl::e_y;
  iVar4 = Fl::e_x;
  if (iVar3 != 0 || this->dragging != 0) {
    if (0x12 < event - 1U) {
      return 0;
    }
    __writefds = (fd_set *)
                 ((long)&switchD_001d5c22::switchdataD_0021cf98 +
                 (long)(int)(&switchD_001d5c22::switchdataD_0021cf98)[event - 1U]);
    switch(event) {
    case 1:
      iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
      if ((iVar4 != 0) &&
         (pFVar8 = Fl_Widget::window((Fl_Widget *)this), pFVar8 != (Fl_Window *)0x0)) {
        uVar6 = (this->text_area).h;
        __writefds = (fd_set *)(ulong)uVar6;
        iVar4 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,uVar6);
        pFVar8 = Fl_Widget::window((Fl_Widget *)this);
        FVar11 = FL_CURSOR_INSERT;
        if (iVar4 == 0) {
          FVar11 = FL_CURSOR_DEFAULT;
        }
        Fl_Window::cursor(pFVar8,FVar11);
      }
      if ((Fl_Text_Display *)Fl::focus_ != this) {
        Fl::focus((Fl_Widget *)this);
        (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
      }
      iVar4 = Fl_Group::handle(&this->super_Fl_Group,1);
      if (iVar4 != 0) {
        return 1;
      }
      if ((Fl::e_state & 0x10000U) == 0) {
        this->dragging = 1;
        iVar4 = xy_to_position(this,Fl::e_x,Fl::e_y,(int)__writefds);
        this->dragPos = iVar4;
        iVar3 = Fl_Text_Selection::includes(&this->mBuffer->mPrimary,iVar4);
        iVar5 = Fl::e_clicks;
        if (iVar3 == 0) {
          this->dragType = Fl::e_clicks;
          if (iVar5 == 1) {
            pFVar1 = this->mBuffer;
            iVar5 = Fl_Text_Buffer::word_start(pFVar1,iVar4);
            uVar6 = Fl_Text_Buffer::word_end(this->mBuffer,iVar4);
            Fl_Text_Buffer::select(pFVar1,iVar5,(fd_set *)(ulong)uVar6,__writefds,in_R8,in_R9);
            iVar5 = Fl_Text_Buffer::word_start(this->mBuffer,iVar4);
            this->dragPos = iVar5;
          }
          else if (iVar5 == 0) {
            Fl_Text_Buffer::unselect(this->mBuffer);
          }
          if ((this->mBuffer->mPrimary).mSelected == true) {
            iVar4 = (this->mBuffer->mPrimary).mEnd;
          }
          insert_position(this,iVar4);
          this->display_insert_position_hint = 1;
          (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
                    (this,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.x_,
                     (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
                     (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.w_,
                     (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
          return 1;
        }
        this->dragType = -1;
        return 1;
      }
      UNRECOVERED_JUMPTABLE = (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3];
      uVar12 = 5;
      break;
    case 2:
      if ((((Fl::e_is_click != 0) && (Fl::e_clicks == 0)) &&
          (iVar4 = Fl_Text_Selection::includes(&this->mBuffer->mPrimary,this->dragPos), iVar4 != 0))
         && ((Fl::e_state & 0x10000U) == 0)) {
        Fl_Text_Buffer::unselect(this->mBuffer);
        insert_position(this,this->dragPos);
        return 1;
      }
      if ((Fl::e_clicks == 2) && (Fl::e_keysym == 0xfee9)) {
        pFVar1 = this->mBuffer;
        iVar4 = Fl_Text_Buffer::line_start(pFVar1,this->dragPos);
        this_00 = this->mBuffer;
        iVar5 = Fl_Text_Buffer::line_end(this_00,this->dragPos);
        uVar6 = Fl_Text_Buffer::next_char(this_00,iVar5);
        Fl_Text_Buffer::select(pFVar1,iVar4,(fd_set *)(ulong)uVar6,__writefds,in_R8,in_R9);
        iVar4 = line_start(this,this->dragPos);
        this->dragPos = iVar4;
      }
      else {
        this->dragging = 0;
        if (scroll_direction != 0) {
          Fl::remove_timeout(scroll_timer_cb,this);
          scroll_direction = 0;
        }
      }
      this->dragType = 0;
      goto LAB_001d6106;
    case 3:
    case 0xb:
      goto switchD_001d5c22_caseD_3;
    case 4:
    case 0xf:
      goto switchD_001d5c22_caseD_4;
    case 5:
      if (this->dragType == -2) {
        return 1;
      }
      if (this->dragType != -1) {
        iVar3 = this->mCursorPos;
        iVar7 = (this->text_area).y;
        if (Fl::e_y < iVar7) {
          scroll_x = Fl::e_x;
          scroll_amount = (Fl::e_y - iVar7) / 5 + -1;
          if (scroll_direction == 0) {
            Fl::add_timeout(0.01,scroll_timer_cb,this);
          }
          scroll_direction = 3;
        }
        else {
          iVar7 = iVar7 + (this->text_area).h;
          if (Fl::e_y < iVar7) {
            iVar7 = (this->text_area).x;
            if (Fl::e_x < iVar7) {
              scroll_y = Fl::e_y;
              scroll_amount = (Fl::e_x - iVar7) / 2 + -1;
              if (scroll_direction == 0) {
                Fl::add_timeout(0.01,scroll_timer_cb,this);
              }
              scroll_direction = 2;
            }
            else {
              iVar7 = iVar7 + (this->text_area).w;
              posType = Fl::e_x - iVar7;
              if (Fl::e_x < iVar7) {
                if (scroll_direction != 0) {
                  Fl::remove_timeout(scroll_timer_cb,this);
                  scroll_direction = 0;
                }
                iVar4 = xy_to_position(this,iVar4,iVar5,posType);
                iVar3 = Fl_Text_Buffer::next_char(this->mBuffer,iVar4);
              }
              else {
                scroll_y = Fl::e_y;
                scroll_amount = posType / 2 + 1;
                if (scroll_direction == 0) {
                  Fl::add_timeout(0.01,scroll_timer_cb,this);
                }
                scroll_direction = 1;
              }
            }
          }
          else {
            scroll_x = Fl::e_x;
            scroll_amount = (Fl::e_y - iVar7) / 5 + 1;
            if (scroll_direction == 0) {
              Fl::add_timeout(0.01,scroll_timer_cb,this);
            }
            scroll_direction = 4;
          }
        }
        fl_text_drag_me(iVar3,this);
        return 1;
      }
      if (Fl::e_is_click != 0) {
        return 1;
      }
      bVar2 = Fl::option(OPTION_DND_TEXT);
      if (!bVar2) {
        return 1;
      }
      pEVar9 = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(this->mBuffer);
      Fl::dnd();
      goto LAB_001d5e10;
    case 6:
      goto switchD_001d5c22_caseD_6;
    case 7:
      goto switchD_001d5c22_caseD_7;
    case 8:
      goto switchD_001d5c22_caseD_8;
    default:
      goto LAB_001d6175;
    case 0xc:
      if (this->shortcut_ == 0) {
        iVar4 = Fl_Widget::test_shortcut((Fl_Widget *)this);
      }
      else {
        iVar4 = Fl::test_shortcut(this->shortcut_);
      }
      if (iVar4 == 0) {
        return 0;
      }
      bVar2 = Fl::option(OPTION_VISIBLE_FOCUS);
      if (!bVar2) {
        return 0;
      }
      iVar4 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3])(this,6);
      if (iVar4 == 0) {
        return 0;
      }
      Fl::focus((Fl_Widget *)this);
      return 1;
    case 0x13:
      if (Fl::e_dy == 0) {
        this = (Fl_Text_Display *)this->mHScrollBar;
      }
      else {
        this = (Fl_Text_Display *)this->mVScrollBar;
      }
      UNRECOVERED_JUMPTABLE = (this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[3];
      uVar12 = 0x13;
    }
    iVar4 = (*UNRECOVERED_JUMPTABLE)(this,uVar12);
    return iVar4;
  }
  switch(event) {
  case 3:
  case 0xb:
switchD_001d5c22_caseD_3:
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = Fl::event_inside((this->text_area).x,(this->text_area).y,(this->text_area).w,
                             (this->text_area).h);
    pFVar8 = Fl_Widget::window((Fl_Widget *)this);
    if (iVar4 != 0) {
      FVar11 = FL_CURSOR_INSERT;
      goto LAB_001d5da9;
    }
    break;
  case 4:
switchD_001d5c22_caseD_4:
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar4 == 0) {
      return 0;
    }
    pFVar8 = Fl_Widget::window((Fl_Widget *)this);
    if (pFVar8 == (Fl_Window *)0x0) {
      return 0;
    }
    pFVar8 = Fl_Widget::window((Fl_Widget *)this);
    break;
  default:
    iVar4 = Fl_Group::handle(&this->super_Fl_Group,event);
    return iVar4;
  case 6:
    goto switchD_001d5c22_caseD_6;
  case 7:
switchD_001d5c22_caseD_7:
    iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
    if ((iVar4 != 0) && (pFVar8 = Fl_Widget::window((Fl_Widget *)this), pFVar8 != (Fl_Window *)0x0))
    {
      pFVar8 = Fl_Widget::window((Fl_Widget *)this);
      Fl_Window::cursor(pFVar8,FL_CURSOR_DEFAULT);
    }
    goto switchD_001d5c22_caseD_6;
  case 8:
switchD_001d5c22_caseD_8:
    if ((((uint)Fl::e_state >> 0x12 & 1) != 0) && (Fl::e_keysym == 99)) {
      if ((this->mBuffer->mPrimary).mSelected == false) {
        return 1;
      }
      pEVar9 = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(this->mBuffer);
      if (*pEVar9 != (EVP_PKEY_CTX)0x0) {
        sVar10 = strlen((char *)pEVar9);
        Fl::copy(pEVar9,(EVP_PKEY_CTX *)(sVar10 & 0xffffffff));
      }
LAB_001d5e10:
      free(pEVar9);
      return 1;
    }
    if ((((uint)Fl::e_state >> 0x12 & 1) == 0) || (Fl::e_keysym != 0x61)) {
      iVar4 = (*(this->mVScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.
                _vptr_Fl_Widget[3])(this->mVScrollBar,8);
      if (iVar4 != 0) {
        return 1;
      }
      iVar4 = (*(this->mHScrollBar->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.
                _vptr_Fl_Widget[3])(this->mHScrollBar,8);
      if (iVar4 == 0) {
        return 0;
      }
      return 1;
    }
    Fl_Text_Buffer::select
              (this->mBuffer,0,(fd_set *)(ulong)(uint)this->mBuffer->mLength,
               (fd_set *)(ulong)(uint)Fl::e_state,in_R8,in_R9);
LAB_001d6106:
    pEVar9 = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(this->mBuffer);
    if (*pEVar9 != (EVP_PKEY_CTX)0x0) {
      sVar10 = strlen((char *)pEVar9);
      Fl::copy(pEVar9,(EVP_PKEY_CTX *)(sVar10 & 0xffffffff));
    }
    free(pEVar9);
    return 1;
  case 9:
LAB_001d6175:
    return 0;
  }
  FVar11 = FL_CURSOR_DEFAULT;
LAB_001d5da9:
  Fl_Window::cursor(pFVar8,FVar11);
  return 1;
switchD_001d5c22_caseD_6:
  if (((this->mBuffer->mPrimary).mSelected != false) &&
     (iVar4 = Fl_Text_Buffer::selection_position(this->mBuffer,&local_2c,&local_30), iVar4 != 0)) {
    redisplay_range(this,local_2c,local_30);
  }
  if (((this->mBuffer->mSecondary).mSelected != false) &&
     (iVar4 = Fl_Text_Buffer::secondary_selection_position(this->mBuffer,&local_2c,&local_30),
     iVar4 != 0)) {
    redisplay_range(this,local_2c,local_30);
  }
  if ((this->mBuffer->mHighlight).mSelected != false) {
    iVar4 = Fl_Text_Buffer::highlight_position(this->mBuffer,&local_2c,&local_30);
    if (iVar4 != 0) {
      redisplay_range(this,local_2c,local_30);
      return 1;
    }
    return 1;
  }
  return 1;
}

Assistant:

int Fl_Text_Display::handle(int event) {
  if (!buffer()) return 0;
  // This isn't very elegant!
  if (!Fl::event_inside(text_area.x, text_area.y, text_area.w, text_area.h) &&
      !dragging && event != FL_LEAVE && event != FL_ENTER &&
      event != FL_MOVE && event != FL_FOCUS && event != FL_UNFOCUS &&
      event != FL_KEYBOARD && event != FL_KEYUP) {
    return Fl_Group::handle(event);
  }

  switch (event) {
    case FL_ENTER:
    case FL_MOVE:
      if (active_r()) {
        if (Fl::event_inside(text_area.x, text_area.y, text_area.w,
	                     text_area.h)) window()->cursor(FL_CURSOR_INSERT);
	else window()->cursor(FL_CURSOR_DEFAULT);
	return 1;
      } else {
        return 0;
      }

    case FL_LEAVE:
    case FL_HIDE:
      if (active_r() && window()) {
        window()->cursor(FL_CURSOR_DEFAULT);

	return 1;
      } else {
	return 0;
      }

    case FL_PUSH: {
      if (active_r() && window()) {
        if (Fl::event_inside(text_area.x, text_area.y, text_area.w,
                             text_area.h)) window()->cursor(FL_CURSOR_INSERT);
        else window()->cursor(FL_CURSOR_DEFAULT);
      }

      if (Fl::focus() != this) {
        Fl::focus(this);
        handle(FL_FOCUS);
      }
      if (Fl_Group::handle(event)) return 1;
      if (Fl::event_state()&FL_SHIFT) return handle(FL_DRAG);
      dragging = 1;
      int pos = xy_to_position(Fl::event_x(), Fl::event_y(), CURSOR_POS);
      dragPos = pos;
      if (buffer()->primary_selection()->includes(pos)) {
        dragType = DRAG_START_DND;
        return 1;
      }
      dragType = Fl::event_clicks();
      if (dragType == DRAG_CHAR) {
        buffer()->unselect();
//	Fl::copy("", 0, 0); /* removed for STR 2668 */
      }
      else if (dragType == DRAG_WORD) {
        buffer()->select(word_start(pos), word_end(pos));
	dragPos = word_start(pos);
	}

      if (buffer()->primary_selection()->selected())
        insert_position(buffer()->primary_selection()->end());
      else
        insert_position(pos);
      show_insert_position();
      return 1;
    }

    case FL_DRAG: {
      if (dragType==DRAG_NONE)
        return 1;
      if (dragType==DRAG_START_DND) {
        if (!Fl::event_is_click() && Fl::dnd_text_ops()) {
          const char* copy = buffer()->selection_text();
#ifdef __APPLE__
          Fl_X::dnd(1);
#else
          Fl::dnd();
#endif
          free((void*)copy);
        }
        return 1;
      }
      int X = Fl::event_x(), Y = Fl::event_y(), pos = insert_position();
      // if we leave the text_area, we start a timer event
      // that will take care of scrolling and selecting
      if (Y < text_area.y) {
        scroll_x = X;
        scroll_amount = (Y - text_area.y) / 5 - 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 3;
      } else if (Y >= text_area.y+text_area.h) {
        scroll_x = X;
        scroll_amount = (Y - text_area.y - text_area.h) / 5 + 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 4;
      } else if (X < text_area.x) {
        scroll_y = Y;
        scroll_amount = (X - text_area.x) / 2 - 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 2;
      } else if (X >= text_area.x+text_area.w) {
        scroll_y = Y;
        scroll_amount = (X - text_area.x - text_area.w) / 2 + 1;
        if (!scroll_direction) {
          Fl::add_timeout(.01, scroll_timer_cb, this);
        }
        scroll_direction = 1;
      } else {
        if (scroll_direction) {
          Fl::remove_timeout(scroll_timer_cb, this);
          scroll_direction = 0;
        }
        pos = xy_to_position(X, Y, CURSOR_POS);
        pos = buffer()->next_char(pos);
      }
      fl_text_drag_me(pos, this);
      return 1;
    }

    case FL_RELEASE: {
      if (Fl::event_is_click() && (! Fl::event_clicks()) &&
	  buffer()->primary_selection()->includes(dragPos) && !(Fl::event_state()&FL_SHIFT) ) {
	buffer()->unselect(); // clicking in the selection: unselect and move cursor
	insert_position(dragPos);
	return 1;
      } else if (Fl::event_clicks() == DRAG_LINE && Fl::event_button() == FL_LEFT_MOUSE) {
        buffer()->select(buffer()->line_start(dragPos), buffer()->next_char(buffer()->line_end(dragPos)));
	dragPos = line_start(dragPos);
	dragType = DRAG_CHAR;
      } else {
	dragging = 0;
	if (scroll_direction) {
	  Fl::remove_timeout(scroll_timer_cb, this);
	  scroll_direction = 0;
	}

	// convert from WORD or LINE selection to CHAR
	/*if (insert_position() >= dragPos)
	  dragPos = buffer()->primary_selection()->start();
	else
	  dragPos = buffer()->primary_selection()->end();*/
	dragType = DRAG_CHAR;
      }

      const char* copy = buffer()->selection_text();
      if (*copy) Fl::copy(copy, (int) strlen(copy), 0);
      free((void*)copy);
      return 1;
    }

    case FL_MOUSEWHEEL:
      if (Fl::event_dy()) return mVScrollBar->handle(event);
      else return mHScrollBar->handle(event);

    case FL_UNFOCUS:
      if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    case FL_FOCUS:
      if (buffer()->selected()) {
        int start, end;
        if (buffer()->selection_position(&start, &end))
          redisplay_range(start, end);
      }
      if (buffer()->secondary_selected()) {
        int start, end;
        if (buffer()->secondary_selection_position(&start, &end))
          redisplay_range(start, end);
      }
      if (buffer()->highlight()) {
        int start, end;
        if (buffer()->highlight_position(&start, &end))
          redisplay_range(start, end);
      }
      return 1;

    case FL_KEYBOARD:
      // Copy?
      if ((Fl::event_state()&(FL_CTRL|FL_COMMAND)) && Fl::event_key()=='c') {
        if (!buffer()->selected()) return 1;
        const char *copy = buffer()->selection_text();
        if (*copy) Fl::copy(copy, (int) strlen(copy), 1);
        free((void*)copy);
        return 1;
      }

      // Select all ?
      if ((Fl::event_state()&(FL_CTRL|FL_COMMAND)) && Fl::event_key()=='a') {
        buffer()->select(0,buffer()->length());
        const char *copy = buffer()->selection_text();
        if (*copy) Fl::copy(copy, (int) strlen(copy), 0);
        free((void*)copy);
        return 1;
      }

      if (mVScrollBar->handle(event)) return 1;
      if (mHScrollBar->handle(event)) return 1;

      break;

    case FL_SHORTCUT:
      if (!(shortcut() ? Fl::test_shortcut(shortcut()) : test_shortcut()))
        return 0;
      if (Fl::visible_focus() && handle(FL_FOCUS)) {
        Fl::focus(this);
        return 1;
      }
      break;

  }

  return 0;
}